

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_send2cluster(fio_msg_internal_s *m)

{
  int16_t iVar1;
  int iVar2;
  fio_msg_internal_s *pfVar3;
  fio_msg_internal_s *m_local;
  
  iVar1 = fio_is_running();
  if (iVar1 == 0) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: facio.io cluster inactive, can\'t send message.");
    }
  }
  else if (fio_data->workers != 1) {
    iVar2 = fio_is_master();
    if (iVar2 == 0) {
      pfVar3 = fio_msg_internal_dup(m);
      fio_cluster_client_sender(pfVar3,-1);
    }
    else {
      pfVar3 = fio_msg_internal_dup(m);
      fio_cluster_server_sender(pfVar3,-1);
    }
  }
  return;
}

Assistant:

static void fio_send2cluster(fio_msg_internal_s *m) {
  if (!fio_is_running()) {
    FIO_LOG_ERROR("facio.io cluster inactive, can't send message.");
    return;
  }
  if (fio_data->workers == 1) {
    /* nowhere to send to */
    return;
  }
  if (fio_is_master()) {
    fio_cluster_server_sender(fio_msg_internal_dup(m), -1);
  } else {
    fio_cluster_client_sender(fio_msg_internal_dup(m), -1);
  }
}